

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

bool __thiscall Potassco::SmodelsInput::readRules(SmodelsInput *this)

{
  AbstractProgram *pAVar1;
  uint uVar2;
  Atom_t AVar3;
  uint uVar4;
  RuleBuilder *pRVar5;
  int iVar6;
  Head_t ht;
  bool bVar7;
  RuleBuilder rule;
  Weight_t local_44;
  RuleBuilder local_40;
  
  RuleBuilder::RuleBuilder(&local_40);
  local_44 = 0;
LAB_001189e2:
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"rule type expected");
  uVar4 = uVar2;
  if (uVar2 == 0) {
LAB_00118bdf:
    RuleBuilder::~RuleBuilder(&local_40);
    return (bool)(uVar2 == 0 | (byte)uVar4 & 1);
  }
  RuleBuilder::clear(&local_40);
  switch(uVar2) {
  case 1:
    pRVar5 = RuleBuilder::start(&local_40,(Head_t)0x0);
    AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
    RuleBuilder::addHead(pRVar5,AVar3);
    break;
  case 2:
  case 5:
    pRVar5 = RuleBuilder::start(&local_40,(Head_t)0x0);
    AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
    RuleBuilder::addHead(pRVar5,AVar3);
    matchSum(this,&local_40,uVar2 == 5);
    goto LAB_00118b4e;
  case 3:
  case 8:
    ht.val_._1_3_ = 0;
    ht.val_._0_1_ = uVar2 == 3;
    RuleBuilder::start(&local_40,ht);
    AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"positive head size expected");
    iVar6 = AVar3 + 1;
    while (iVar6 = iVar6 + -1, iVar6 != 0) {
      AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
      RuleBuilder::addHead(&local_40,AVar3);
    }
    break;
  case 4:
  case 7:
switchD_00118a17_caseD_4:
    bVar7 = ProgramReader::require(&this->super_ProgramReader,false,"unrecognized rule type");
    uVar4 = (uint)bVar7;
    goto LAB_00118bdf;
  case 6:
    RuleBuilder::startMinimize(&local_40,local_44);
    matchSum(this,&local_40,true);
    local_44 = local_44 + 1;
    RuleBuilder::end(&local_40,this->out_);
    goto LAB_001189e2;
  default:
    if (uVar2 - 0x5b < 2) {
      ProgramReader::require
                (&this->super_ProgramReader,(this->opts_).claspExt,"unrecognized rule type");
      if (uVar2 == 0x5b) {
        AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
        pAVar1 = this->out_;
        uVar4 = ProgramReader::matchPos(&this->super_ProgramReader,2,"0..2 expected");
        (*pAVar1->_vptr_AbstractProgram[9])(pAVar1,(ulong)AVar3,(ulong)((uVar4 ^ 3) - 1));
      }
      else {
        pAVar1 = this->out_;
        AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
        (*pAVar1->_vptr_AbstractProgram[9])(pAVar1,(ulong)AVar3,3);
      }
    }
    else {
      if (uVar2 != 0x5a) goto switchD_00118a17_caseD_4;
      if ((this->opts_).claspExt == true) {
        uVar4 = ProgramReader::matchPos
                          (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
        bVar7 = uVar4 == 0;
      }
      else {
        bVar7 = false;
      }
      ProgramReader::require(&this->super_ProgramReader,bVar7,"unrecognized rule type");
    }
    goto LAB_001189e2;
  }
  matchBody(this,&local_40);
LAB_00118b4e:
  RuleBuilder::end(&local_40,this->out_);
  goto LAB_001189e2;
}

Assistant:

bool SmodelsInput::readRules() {
	RuleBuilder rule;
	Weight_t minPrio = 0;
	for (unsigned rt; (rt = matchPos("rule type expected")) != 0;) {
		rule.clear();
		switch (rt) {
			default: return require(false, "unrecognized rule type");
			case Choice: case Disjunctive: // n a1..an
				rule.start(rt == Choice ? Head_t::Choice : Head_t::Disjunctive);
				for (unsigned i = matchAtom("positive head size expected"); i--;) { rule.addHead(matchAtom()); }
				matchBody(rule);
				rule.end(&out_);
				break;
			case Basic:
				rule.start(Head_t::Disjunctive).addHead(matchAtom());
				matchBody(rule);
				rule.end(&out_);
				break;
			case Cardinality: // fall through
			case Weight:      // fall through
				rule.start(Head_t::Disjunctive).addHead(matchAtom());
				matchSum(rule, rt == Weight);
				rule.end(&out_);
				break;
			case Optimize:
				rule.startMinimize(minPrio++);
				matchSum(rule, true);
				rule.end(&out_);
				break;
			case ClaspIncrement:
				require(opts_.claspExt && matchPos() == 0, "unrecognized rule type");
				break;
			case ClaspAssignExt:
			case ClaspReleaseExt:
				require(opts_.claspExt, "unrecognized rule type");
				if (rt == ClaspAssignExt) {
					Atom_t rHead = matchAtom();
					out_.external(rHead, static_cast<Value_t>((matchPos(2, "0..2 expected") ^ 3) - 1));
				}
				else {
					out_.external(matchAtom(), Value_t::Release);
				}
				break;
		}
	}
	return true;
}